

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void spell_lesser_golem(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  int charges;
  int iVar3;
  CHAR_DATA *pCVar4;
  CHAR_DATA *in_RDX;
  undefined2 in_DI;
  __type_conflict2 _Var5;
  AFFECT_DATA af;
  CHAR_DATA *check;
  int num;
  char type [4608];
  float dmgMultiplier;
  float armorMultiplier;
  int vnum;
  CHAR_DATA *mob;
  undefined4 in_stack_ffffffffffffed38;
  int in_stack_ffffffffffffed3c;
  char *in_stack_ffffffffffffed40;
  CHAR_DATA *ch_00;
  undefined4 in_stack_ffffffffffffed48;
  int in_stack_ffffffffffffed4c;
  CHAR_DATA *in_stack_ffffffffffffed50;
  undefined2 in_stack_ffffffffffffed68;
  undefined2 uVar6;
  short sVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 in_stack_ffffffffffffed76;
  CHAR_DATA *master;
  undefined4 in_stack_ffffffffffffedc0;
  char local_1238 [72];
  PC_DATA *in_stack_ffffffffffffee10;
  float local_34;
  float local_30;
  
  local_34 = 1.0;
  target_name = one_argument(in_stack_ffffffffffffed40,
                             (char *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
  charges = atoi(target_name);
  bVar1 = str_cmp(local_1238,"");
  if (bVar1) {
    bVar1 = str_cmp(local_1238,"blood");
    if (((bVar1) && (bVar1 = str_cmp(local_1238,"bone"), bVar1)) &&
       (bVar1 = str_cmp(local_1238,"flesh"), bVar1)) {
      send_to_char((char *)in_stack_ffffffffffffed50,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48));
    }
    else if (charges == 0) {
      send_to_char((char *)in_stack_ffffffffffffed50,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48));
    }
    else if (charges < 0x15) {
      bVar1 = is_affected(in_RDX,(int)gsn_lesser_golem);
      master = char_list;
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffed50,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48));
      }
      else {
        for (; master != (CHAR_DATA *)0x0; master = master->next) {
          bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38))
          ;
          if (((bVar1) && (master->master == in_RDX)) &&
             ((master->pIndexData->vnum == 0xb8b ||
              ((master->pIndexData->vnum == 0xb8c || (master->pIndexData->vnum == 0xb8d)))))) {
            send_to_char((char *)in_stack_ffffffffffffed50,
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48))
            ;
            return;
          }
        }
        bVar1 = drain_urn(in_RDX,charges);
        if (bVar1) {
          bVar1 = str_cmp(local_1238,"blood");
          if (!bVar1) {
            local_34 = 1.5;
          }
          local_30 = 1.0;
          bVar1 = str_cmp(local_1238,"bone");
          if (!bVar1) {
            local_30 = 3.0;
            local_34 = 0.5;
          }
          bVar1 = str_cmp(local_1238,"flesh");
          if (!bVar1) {
            local_30 = 2.0;
            local_34 = 1.0;
          }
          ch_00 = (CHAR_DATA *)&stack0xffffffffffffed50;
          init_affect((AFFECT_DATA *)0x6caf75);
          uVar6 = 0;
          uVar8 = 0;
          uVar9 = 0;
          iVar3 = dice((int)ch_00,in_stack_ffffffffffffed3c);
          uVar2 = (undefined2)iVar3;
          sVar7 = in_RDX->level;
          affect_to_char(ch_00,(AFFECT_DATA *)
                               CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38));
          get_mob_index(in_stack_ffffffffffffed4c);
          pCVar4 = create_mobile((MOB_INDEX_DATA *)in_stack_ffffffffffffee10);
          pCVar4->max_hit = (short)(int)((float)(int)in_RDX->max_hit * local_30);
          pCVar4->hit = (int)pCVar4->max_hit;
          pCVar4->damroll = 0;
          iVar3 = in_RDX->level + -10;
          pCVar4->level = (short)iVar3 + (short)(charges / 2);
          pCVar4->damage[1] = 2;
          pCVar4->damage[0] = pCVar4->level;
          pCVar4->damage[2] = pCVar4->level / 3 + (short)(int)((float)charges * local_34);
          add_follower((CHAR_DATA *)CONCAT44(charges,in_stack_ffffffffffffedc0),master);
          pCVar4->leader = in_RDX;
          _Var5 = std::pow<int,int>(0,0x6cb140);
          pCVar4->affected_by[0] = (long)_Var5 | pCVar4->affected_by[0];
          char_to_room((CHAR_DATA *)
                       CONCAT26(in_stack_ffffffffffffed76,CONCAT24(uVar9,CONCAT22(uVar8,uVar2))),
                       (ROOM_INDEX_DATA *)
                       CONCAT26(sVar7,CONCAT24(in_DI,CONCAT22(uVar6,in_stack_ffffffffffffed68))));
          act((char *)in_stack_ffffffffffffed50,
              (CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffed48),ch_00,
              (void *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),0);
          act((char *)in_stack_ffffffffffffed50,
              (CHAR_DATA *)CONCAT44(iVar3,in_stack_ffffffffffffed48),ch_00,
              (void *)CONCAT44(in_stack_ffffffffffffed3c,in_stack_ffffffffffffed38),0);
        }
      }
    }
    else {
      send_to_char((char *)in_stack_ffffffffffffed50,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48));
    }
  }
  else {
    send_to_char((char *)in_stack_ffffffffffffed50,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed4c,in_stack_ffffffffffffed48));
  }
  return;
}

Assistant:

void spell_lesser_golem(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *mob;
	int vnum = 0;
	float armorMultiplier = 1;
	float dmgMultiplier = 1;
	char type[MSL];
	int num;
	CHAR_DATA *check;
	AFFECT_DATA af;

	target_name = one_argument(target_name, type);
	num = atoi(target_name);

	if (!str_cmp(type, ""))
	{
		send_to_char("Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (str_cmp(type, "blood") && str_cmp(type, "bone") && str_cmp(type, "flesh"))
	{
		send_to_char("That is not an acceptable golem type.\n\r" \
					"Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (num == 0)
	{
		send_to_char("You must use at least one ounce of blood.\n\r" \
					"Syntax:  cast 'lesser golem' <bone/blood/flesh> <ounces of blood>\n\r", ch);
		return;
	}

	if (num > 20)
	{
		send_to_char("You cannot use more than twenty ounces of blood at once.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_lesser_golem))
	{
		send_to_char("You cannot create another lesser golem so soon.\n\r", ch);
		return;
	}

	for (check = char_list; check != nullptr; check = check->next)
	{
		if (is_npc(check)
			&& check->master == ch
			&& (check->pIndexData->vnum == 2955 || check->pIndexData->vnum == 2956 || check->pIndexData->vnum == 2957))
		{
			send_to_char("You already have a golem under your command.\n\r", ch);
			return;
		}
	}

	
	if (!drain_urn(ch, num))
		return;

	if (!str_cmp(type, "blood"))
	{
		vnum = 2957;
		armorMultiplier = 1;
		dmgMultiplier = 1.5;
	}

	if (!str_cmp(type, "bone"))
	{
		vnum = 2956;
		armorMultiplier = 3;
		dmgMultiplier = 0.5;
	}

	if (!str_cmp(type, "flesh"))
	{
		vnum = 2955;
		armorMultiplier =  2;
		dmgMultiplier = 1;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_TIMER;
	af.location = 0;
	af.modifier = 0;
	af.duration = dice(5, 8);
	af.type = sn;
	af.level = ch->level;
	affect_to_char(ch, &af);

	mob = create_mobile(get_mob_index(vnum));
	mob->max_hit = (short)(ch->max_hit * armorMultiplier);
	mob->hit = mob->max_hit;
	mob->damroll = 0;
	mob->level = ch->level - 10 + (num / 2);
	mob->damage[DICE_TYPE] = 2;
	mob->damage[DICE_NUMBER] = mob->level;
	mob->damage[DICE_BONUS] = (mob->level / 3) + (int)(num * dmgMultiplier);

	add_follower(mob, ch);

	mob->leader = ch;

	SET_BIT(mob->affected_by, AFF_CHARM);

	char_to_room(mob, ch->in_room);

	act("$n pours some blood on the floor.  It begins shifting and changing, finally forming $N!", ch, 0, mob, TO_ROOM);
	act("You pour some blood on the floor.  It begins shifting and changing, finally forming $N!", ch, 0, mob, TO_CHAR);
}